

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_special_functions.cc
# Opt level: O0

void check_function<arg_res_tuple<double,2ul>,double>(arg_res_tuple<double,_2UL> *x_yref,double y)

{
  StringRef capturedExpression;
  ExprLhs<bool> EVar1;
  __tuple_element_t<0UL,_tuple<double,_double>_> *p_Var2;
  __tuple_element_t<1UL,_tuple<double,_double>_> *p_Var3;
  ostream *poVar4;
  basic_ostream<char,_std::char_traits<char>_> *pbVar5;
  ScopedMessage *this;
  MessageBuilder *builder;
  AssertionHandler *this_00;
  MessageBuilder *this_01;
  MessageBuilder *this_02;
  long in_RDI;
  double in_XMM0_Qa;
  AssertionHandler catchAssertionHandler;
  ScopedMessage scopedMessage0;
  stringstream stream;
  double y_max;
  double y_min;
  tuple<double,_double> y_min_max;
  double y_ref;
  undefined4 in_stack_fffffffffffffc28;
  Flags in_stack_fffffffffffffc2c;
  undefined6 in_stack_fffffffffffffc30;
  undefined1 in_stack_fffffffffffffc36;
  undefined1 in_stack_fffffffffffffc37;
  undefined1 uVar6;
  args<double,_2UL> *in_stack_fffffffffffffc38;
  OfType type;
  SourceLineInfo *this_03;
  SourceLineInfo *in_stack_fffffffffffffc40;
  SourceLineInfo *this_04;
  double in_stack_fffffffffffffc68;
  SourceLineInfo local_330;
  StringRef local_320;
  string local_2c8 [32];
  SourceLineInfo local_2a8;
  StringRef local_298;
  int local_1c4;
  stringstream local_1c0 [16];
  ostream local_1b0 [376];
  __tuple_element_t<1UL,_tuple<double,_double>_> local_38;
  __tuple_element_t<0UL,_tuple<double,_double>_> local_30;
  undefined8 local_18;
  double local_10;
  
  local_18 = *(undefined8 *)(in_RDI + 0x10);
  local_10 = in_XMM0_Qa;
  bounds<double>(in_stack_fffffffffffffc68);
  p_Var2 = std::get<0ul,double,double>((tuple<double,_double> *)0x3c7c23);
  local_30 = *p_Var2;
  p_Var3 = std::get<1ul,double,double>((tuple<double,_double> *)0x3c7c3a);
  local_38 = *p_Var3;
  std::__cxx11::stringstream::stringstream(local_1c0);
  local_1c4 = (int)Catch::clara::std::setprecision(0x10);
  poVar4 = std::operator<<(local_1b0,(_Setprecision)local_1c4);
  std::operator<<(poVar4,"args: ");
  pbVar5 = operator<<((basic_ostream<char,_std::char_traits<char>_> *)in_stack_fffffffffffffc40,
                      in_stack_fffffffffffffc38);
  type = (OfType)((ulong)in_stack_fffffffffffffc38 >> 0x20);
  poVar4 = std::operator<<((ostream *)pbVar5,"\n");
  this = (ScopedMessage *)std::operator<<(poVar4,"lower bound: ");
  builder = (MessageBuilder *)std::ostream::operator<<(this,local_30);
  poVar4 = std::operator<<((ostream *)builder,"\n");
  poVar4 = std::operator<<(poVar4,"upper bound: ");
  this_00 = (AssertionHandler *)std::ostream::operator<<(poVar4,local_38);
  poVar4 = std::operator<<((ostream *)this_00,"\n");
  this_01 = (MessageBuilder *)std::operator<<(poVar4,"actual     : ");
  std::ostream::operator<<(this_01,local_10);
  local_298 = operator____catch_sr
                        ((char *)CONCAT17(in_stack_fffffffffffffc37,
                                          CONCAT16(in_stack_fffffffffffffc36,
                                                   in_stack_fffffffffffffc30)),
                         CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28));
  this_04 = &local_2a8;
  Catch::SourceLineInfo::SourceLineInfo
            (this_04,
             "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/tests/test_special_functions.cc"
             ,0x79);
  Catch::MessageBuilder::MessageBuilder(this_01,(StringRef *)this_04,in_stack_fffffffffffffc40,type)
  ;
  std::__cxx11::stringstream::str();
  this_02 = Catch::MessageBuilder::operator<<
                      ((MessageBuilder *)
                       CONCAT17(in_stack_fffffffffffffc37,
                                CONCAT16(in_stack_fffffffffffffc36,in_stack_fffffffffffffc30)),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28));
  Catch::ScopedMessage::ScopedMessage(this,builder);
  std::__cxx11::string::~string(local_2c8);
  Catch::MessageBuilder::~MessageBuilder
            ((MessageBuilder *)
             CONCAT17(in_stack_fffffffffffffc37,
                      CONCAT16(in_stack_fffffffffffffc36,in_stack_fffffffffffffc30)));
  local_320 = operator____catch_sr
                        ((char *)CONCAT17(in_stack_fffffffffffffc37,
                                          CONCAT16(in_stack_fffffffffffffc36,
                                                   in_stack_fffffffffffffc30)),
                         CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28));
  this_03 = &local_330;
  Catch::SourceLineInfo::SourceLineInfo
            (this_03,
             "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/tests/test_special_functions.cc"
             ,0x7a);
  Catch::StringRef::StringRef((StringRef *)this_02,(char *)this_03);
  capturedExpression.m_size = (size_type)this_01;
  capturedExpression.m_start = (char *)this_04;
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)this_02,(StringRef *)this_03,
             (SourceLineInfo *)
             CONCAT17(in_stack_fffffffffffffc37,
                      CONCAT16(in_stack_fffffffffffffc36,in_stack_fffffffffffffc30)),
             capturedExpression,in_stack_fffffffffffffc2c);
  uVar6 = local_30 <= local_10 && local_10 <= local_38;
  EVar1 = Catch::Decomposer::operator<=
                    ((Decomposer *)CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28),
                     false);
  Catch::AssertionHandler::handleExpr<bool>(this_00,(ExprLhs<bool> *)poVar4);
  Catch::AssertionHandler::complete
            ((AssertionHandler *)CONCAT17(uVar6,CONCAT16(EVar1.m_lhs,in_stack_fffffffffffffc30)));
  Catch::AssertionHandler::~AssertionHandler
            ((AssertionHandler *)CONCAT17(uVar6,CONCAT16(EVar1.m_lhs,in_stack_fffffffffffffc30)));
  Catch::ScopedMessage::~ScopedMessage((ScopedMessage *)this_02);
  std::__cxx11::stringstream::~stringstream(local_1c0);
  return;
}

Assistant:

void check_function(const T_ref &x_yref, const T y) {
  const T y_ref{x_yref.y};
  const std::tuple<T, T> y_min_max{bounds(y_ref)};
  const T y_min{std::get<0>(y_min_max)};
  const T y_max{std::get<1>(y_min_max)};
  std::stringstream stream;
  stream << std::setprecision(std::numeric_limits<T>::digits10 + 1)
         << "args: " << x_yref.x << "\n"
         << "lower bound: " << y_min << "\n"
         << "upper bound: " << y_max << "\n"
         << "actual     : " << y;
  INFO(stream.str());
  REQUIRE((y_min <= y and y <= y_max));
}